

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O0

Bool ParseTabs(TidyDocImpl *doc,TidyOptionImpl *entry)

{
  Bool BVar1;
  bool bVar2;
  Bool tabs;
  Bool status;
  uint flag;
  TidyOptionImpl *entry_local;
  TidyDocImpl *doc_local;
  
  tabs = no;
  _status = entry;
  entry_local = (TidyOptionImpl *)doc;
  BVar1 = GetParsePickListValue(doc,entry,&tabs);
  if ((BVar1 != no) &&
     (bVar2 = tabs != no, prvTidySetOptionBool((TidyDocImpl *)entry_local,_status->id,(uint)bVar2),
     bVar2 != no)) {
    prvTidySetOptionInt((TidyDocImpl *)entry_local,TidyIndentSpaces,1);
  }
  return BVar1;
}

Assistant:

Bool ParseTabs( TidyDocImpl* doc, const TidyOptionImpl* entry )
{
    uint flag = 0;
    Bool status = GetParsePickListValue( doc, entry, &flag );
    
    if ( status ) {
        Bool tabs = flag != 0 ? yes : no;
        TY_(SetOptionBool)( doc, entry->id, tabs );
        if (tabs) {
            TY_(SetOptionInt)( doc, TidyIndentSpaces, 1 );
        } else {
            /* optional - TY_(ResetOptionToDefault)( doc, TidyIndentSpaces ); */
        }
    }
    return status;
}